

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O1

cJSON_bool cJSON_InsertItemInArray(cJSON *array,int which,cJSON *newitem)

{
  cJSON *pcVar1;
  cJSON_bool cVar2;
  cJSON *pcVar3;
  ulong uVar4;
  bool bVar5;
  
  if (newitem != (cJSON *)0x0 && -1 < which) {
    if (array == (cJSON *)0x0) {
      pcVar3 = (cJSON *)0x0;
    }
    else {
      uVar4 = (ulong)(uint)which;
      pcVar3 = (cJSON *)&array->child;
      do {
        pcVar3 = pcVar3->next;
        bVar5 = uVar4 != 0;
        uVar4 = uVar4 - 1;
        if (pcVar3 == (cJSON *)0x0) break;
      } while (bVar5);
    }
    if (pcVar3 == (cJSON *)0x0) {
      cVar2 = add_item_to_array(array,newitem);
      return cVar2;
    }
    pcVar1 = array->child;
    if ((pcVar3 == pcVar1) || (pcVar3->prev != (cJSON *)0x0)) {
      newitem->next = pcVar3;
      newitem->prev = pcVar3->prev;
      pcVar3->prev = newitem;
      if (pcVar3 == pcVar1) {
        array->child = newitem;
      }
      else {
        newitem->prev->next = newitem;
      }
      return 1;
    }
  }
  return 0;
}

Assistant:

CJSON_PUBLIC(cJSON_bool) cJSON_InsertItemInArray(cJSON *array, int which, cJSON *newitem)
{
    cJSON *after_inserted = NULL;

    if (which < 0 || newitem == NULL)
    {
        return false;
    }

    after_inserted = get_array_item(array, (size_t)which);
    if (after_inserted == NULL)
    {
        return add_item_to_array(array, newitem);
    }

    if (after_inserted != array->child && after_inserted->prev == NULL) {
        /* return false if after_inserted is a corrupted array item */
        return false;
    }

    newitem->next = after_inserted;
    newitem->prev = after_inserted->prev;
    after_inserted->prev = newitem;
    if (after_inserted == array->child)
    {
        array->child = newitem;
    }
    else
    {
        newitem->prev->next = newitem;
    }
    return true;
}